

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset_props.cpp
# Opt level: O2

UnicodeSet * __thiscall
icu_63::UnicodeSet::applyPropertyPattern
          (UnicodeSet *this,UnicodeString *pattern,ParsePosition *ppos,UErrorCode *ec)

{
  short sVar1;
  _func_int *p_Var2;
  UBool UVar3;
  char16_t cVar4;
  int32_t offset;
  uint uVar5;
  uint uVar6;
  undefined6 extraout_var;
  int iVar7;
  ulong uVar8;
  undefined4 uVar9;
  undefined8 unaff_RBP;
  uint local_100;
  UBool local_f9;
  undefined4 local_f8;
  undefined4 local_f4;
  UnicodeString propName;
  UnicodeString valueName;
  UnicodeString local_70;
  
  if (U_ZERO_ERROR < *ec) {
    return this;
  }
  iVar7 = ppos->index;
  sVar1 = (pattern->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    uVar5 = (pattern->fUnion).fFields.fLength;
  }
  else {
    uVar5 = (int)sVar1 >> 5;
  }
  uVar8 = (ulong)uVar5;
  if ((int)uVar5 < iVar7 + 5) goto LAB_0017f264;
  local_f9 = anon_unknown_0::isPOSIXOpen(pattern,iVar7);
  if (local_f9 == '\0') {
    UVar3 = anon_unknown_0::isPerlOpen(pattern,iVar7);
    if ((UVar3 == '\0') && (UVar3 = anon_unknown_0::isNameOpen(pattern,iVar7), UVar3 == '\0'))
    goto LAB_0017f264;
    cVar4 = UnicodeString::doCharAt(pattern,iVar7 + 1);
    local_f8 = (undefined4)CONCAT71((int7)(uVar8 >> 8),cVar4 == L'P');
    uVar9 = (undefined4)CONCAT71((int7)((ulong)unaff_RBP >> 8),cVar4 == L'N');
    local_100 = iVar7 + 2;
    offset = ICU_Utility::skipWhitespace(pattern,(int32_t *)&local_100,'\0');
    sVar1 = (pattern->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar7 = (pattern->fUnion).fFields.fLength;
    }
    else {
      iVar7 = (int)sVar1 >> 5;
    }
    if (offset == iVar7) goto LAB_0017f264;
    local_100 = offset + 1;
    cVar4 = UnicodeString::doCharAt(pattern,offset);
    if (cVar4 != L'{') goto LAB_0017f264;
    uVar5 = UnicodeString::indexOf(pattern,L'}',local_100);
  }
  else {
    local_100 = iVar7 + 2;
    local_100 = ICU_Utility::skipWhitespace(pattern,(int32_t *)&local_100,'\0');
    sVar1 = (pattern->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar7 = (pattern->fUnion).fFields.fLength;
    }
    else {
      iVar7 = (int)sVar1 >> 5;
    }
    if ((int)local_100 < iVar7) {
      cVar4 = UnicodeString::doCharAt(pattern,local_100);
      uVar8 = CONCAT62(extraout_var,cVar4) & 0xffffffff;
      if ((short)uVar8 != 0x5e) goto LAB_0017f0e6;
      local_100 = local_100 + 1;
      local_f8 = (undefined4)CONCAT71((int7)(uVar8 >> 8),1);
    }
    else {
LAB_0017f0e6:
      local_f8 = 0;
    }
    uVar5 = UnicodeString::indexOf(pattern,L":]",2,local_100);
    uVar9 = 0;
  }
  if (-1 < (int)uVar5) {
    uVar6 = UnicodeString::indexOf(pattern,L'=',local_100);
    propName.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_00245838;
    propName.fUnion.fStackFields.fLengthAndFlags = 2;
    valueName.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_00245838;
    valueName.fUnion.fStackFields.fLengthAndFlags = 2;
    p_Var2 = (pattern->super_Replaceable).super_UObject._vptr_UObject[3];
    local_f4 = uVar9;
    if (uVar6 < uVar5 && (char)uVar9 == '\0') {
      (*p_Var2)(pattern,(ulong)local_100,(ulong)uVar6,&propName);
      (*(pattern->super_Replaceable).super_UObject._vptr_UObject[3])
                (pattern,(ulong)(uVar6 + 1),(ulong)uVar5,&valueName);
    }
    else {
      (*p_Var2)(pattern,(ulong)local_100,(ulong)uVar5);
      if ((char)local_f4 != '\0') {
        UnicodeString::operator=(&valueName,&propName);
        UnicodeString::UnicodeString(&local_70,"na",2,kInvariant);
        UnicodeString::moveFrom(&propName,&local_70);
        UnicodeString::~UnicodeString(&local_70);
      }
    }
    applyPropertyAlias(this,&propName,&valueName,ec);
    if (*ec < U_ILLEGAL_ARGUMENT_ERROR) {
      if ((char)local_f8 != '\0') {
        complement(this);
      }
      ppos->index = (uVar5 - (local_f9 == '\0')) + 2;
    }
    UnicodeString::~UnicodeString(&valueName);
    UnicodeString::~UnicodeString(&propName);
    return this;
  }
LAB_0017f264:
  *ec = U_ILLEGAL_ARGUMENT_ERROR;
  return this;
}

Assistant:

UnicodeSet& UnicodeSet::applyPropertyPattern(const UnicodeString& pattern,
                                             ParsePosition& ppos,
                                             UErrorCode &ec) {
    int32_t pos = ppos.getIndex();

    UBool posix = FALSE; // true for [:pat:], false for \p{pat} \P{pat} \N{pat}
    UBool isName = FALSE; // true for \N{pat}, o/w false
    UBool invert = FALSE;

    if (U_FAILURE(ec)) return *this;

    // Minimum length is 5 characters, e.g. \p{L}
    if ((pos+5) > pattern.length()) {
        FAIL(ec);
    }

    // On entry, ppos should point to one of the following locations:
    // Look for an opening [:, [:^, \p, or \P
    if (isPOSIXOpen(pattern, pos)) {
        posix = TRUE;
        pos += 2;
        pos = ICU_Utility::skipWhitespace(pattern, pos);
        if (pos < pattern.length() && pattern.charAt(pos) == COMPLEMENT) {
            ++pos;
            invert = TRUE;
        }
    } else if (isPerlOpen(pattern, pos) || isNameOpen(pattern, pos)) {
        UChar c = pattern.charAt(pos+1);
        invert = (c == UPPER_P);
        isName = (c == UPPER_N);
        pos += 2;
        pos = ICU_Utility::skipWhitespace(pattern, pos);
        if (pos == pattern.length() || pattern.charAt(pos++) != OPEN_BRACE) {
            // Syntax error; "\p" or "\P" not followed by "{"
            FAIL(ec);
        }
    } else {
        // Open delimiter not seen
        FAIL(ec);
    }

    // Look for the matching close delimiter, either :] or }
    int32_t close;
    if (posix) {
      close = pattern.indexOf(POSIX_CLOSE, 2, pos);
    } else {
      close = pattern.indexOf(CLOSE_BRACE, pos);
    }
    if (close < 0) {
        // Syntax error; close delimiter missing
        FAIL(ec);
    }

    // Look for an '=' sign.  If this is present, we will parse a
    // medium \p{gc=Cf} or long \p{GeneralCategory=Format}
    // pattern.
    int32_t equals = pattern.indexOf(EQUALS, pos);
    UnicodeString propName, valueName;
    if (equals >= 0 && equals < close && !isName) {
        // Equals seen; parse medium/long pattern
        pattern.extractBetween(pos, equals, propName);
        pattern.extractBetween(equals+1, close, valueName);
    }

    else {
        // Handle case where no '=' is seen, and \N{}
        pattern.extractBetween(pos, close, propName);
            
        // Handle \N{name}
        if (isName) {
            // This is a little inefficient since it means we have to
            // parse NAME_PROP back to UCHAR_NAME even though we already
            // know it's UCHAR_NAME.  If we refactor the API to
            // support args of (UProperty, char*) then we can remove
            // NAME_PROP and make this a little more efficient.
            valueName = propName;
            propName = UnicodeString(NAME_PROP, NAME_PROP_LENGTH, US_INV);
        }
    }

    applyPropertyAlias(propName, valueName, ec);

    if (U_SUCCESS(ec)) {
        if (invert) {
            complement();
        }
            
        // Move to the limit position after the close delimiter if the
        // parse succeeded.
        ppos.setIndex(close + (posix ? 2 : 1));
    }

    return *this;
}